

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O2

btMatrix3x3 * operator*(btMatrix3x3 *m,btScalar *k)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  btMatrix3x3 *in_RDI;
  
  fVar1 = *k;
  fVar2 = m->m_el[0].m_floats[2];
  fVar3 = m->m_el[1].m_floats[2];
  fVar4 = m->m_el[2].m_floats[2];
  uVar5 = *(undefined8 *)m->m_el[0].m_floats;
  *(ulong *)in_RDI->m_el[0].m_floats =
       CONCAT44((float)((ulong)uVar5 >> 0x20) * fVar1,(float)uVar5 * fVar1);
  in_RDI->m_el[0].m_floats[2] = fVar2 * fVar1;
  in_RDI->m_el[0].m_floats[3] = 0.0;
  uVar5 = *(undefined8 *)m->m_el[1].m_floats;
  *(ulong *)in_RDI->m_el[1].m_floats =
       CONCAT44((float)((ulong)uVar5 >> 0x20) * fVar1,(float)uVar5 * fVar1);
  in_RDI->m_el[1].m_floats[2] = fVar3 * fVar1;
  in_RDI->m_el[1].m_floats[3] = 0.0;
  uVar5 = *(undefined8 *)m->m_el[2].m_floats;
  *(ulong *)in_RDI->m_el[2].m_floats =
       CONCAT44((float)((ulong)uVar5 >> 0x20) * fVar1,(float)uVar5 * fVar1);
  in_RDI->m_el[2].m_floats[2] = fVar4 * fVar1;
  in_RDI->m_el[2].m_floats[3] = 0.0;
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3
operator*(const btMatrix3x3& m, const btScalar & k)
{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))
    __m128 vk = bt_splat_ps(_mm_load_ss((float *)&k), 0x80);
    return btMatrix3x3(
                _mm_mul_ps(m[0].mVec128, vk), 
                _mm_mul_ps(m[1].mVec128, vk), 
                _mm_mul_ps(m[2].mVec128, vk)); 
#elif defined(BT_USE_NEON)
    return btMatrix3x3(
                vmulq_n_f32(m[0].mVec128, k),
                vmulq_n_f32(m[1].mVec128, k),
                vmulq_n_f32(m[2].mVec128, k)); 
#else
	return btMatrix3x3(
		m[0].x()*k,m[0].y()*k,m[0].z()*k,
		m[1].x()*k,m[1].y()*k,m[1].z()*k,
		m[2].x()*k,m[2].y()*k,m[2].z()*k);
#endif
}